

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O1

bool __thiscall
bssl::SSLAEADContext::Seal
          (SSLAEADContext *this,uint8_t *out,size_t *out_len,size_t max_out_len,uint8_t type,
          uint16_t record_version,uint64_t seqnum,Span<const_unsigned_char> header,uint8_t *in,
          size_t in_len)

{
  bool bVar1;
  int iVar2;
  int lib;
  int line;
  undefined7 in_register_00000081;
  undefined6 in_register_0000008a;
  ulong uVar3;
  ulong uVar4;
  size_t suffix_len;
  size_t local_48;
  undefined4 local_40;
  undefined4 local_3c;
  size_t *local_38;
  
  local_3c = (undefined4)CONCAT62(in_register_0000008a,record_version);
  local_40 = (undefined4)CONCAT71(in_register_00000081,type);
  uVar3 = 0;
  if ((this->field_0x26a & 1) != 0) {
    uVar3 = (ulong)this->variable_nonce_len_;
  }
  if (this->cipher_ == (SSL_CIPHER *)0x0) {
    local_48 = 0;
  }
  else {
    iVar2 = EVP_AEAD_CTX_tag_len(&(this->ctx_).ctx_,&local_48,in_len,0);
    if (iVar2 == 0) {
      lib = 0x10;
      iVar2 = 200;
      line = 0x186;
      goto LAB_0014c741;
    }
  }
  uVar4 = uVar3 + in_len;
  local_38 = out_len;
  if ((CARRY8(uVar3,in_len)) || (CARRY8(local_48,uVar4))) {
    lib = 0x1e;
    iVar2 = 200;
    line = 0x18b;
  }
  else {
    if (local_48 + uVar4 <= max_out_len) {
      bVar1 = SealScatter(this,out,out + uVar3,out + uVar3 + in_len,(uint8_t)local_40,
                          (uint16_t)local_3c,seqnum,header,in,in_len,(uint8_t *)0x0,0);
      if (bVar1) {
        *local_38 = uVar4 + local_48;
        return true;
      }
      return false;
    }
    lib = 0x10;
    iVar2 = 0x79;
    line = 399;
  }
LAB_0014c741:
  ERR_put_error(lib,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                ,line);
  return false;
}

Assistant:

bool SSLAEADContext::Seal(uint8_t *out, size_t *out_len, size_t max_out_len,
                          uint8_t type, uint16_t record_version,
                          uint64_t seqnum, Span<const uint8_t> header,
                          const uint8_t *in, size_t in_len) {
  const size_t prefix_len = ExplicitNonceLen();
  size_t suffix_len;
  if (!SuffixLen(&suffix_len, in_len, 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (in_len + prefix_len < in_len ||
      in_len + prefix_len + suffix_len < in_len + prefix_len) {
    OPENSSL_PUT_ERROR(CIPHER, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (in_len + prefix_len + suffix_len > max_out_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BUFFER_TOO_SMALL);
    return false;
  }

  if (!SealScatter(out, out + prefix_len, out + prefix_len + in_len, type,
                   record_version, seqnum, header, in, in_len, 0, 0)) {
    return false;
  }
  *out_len = prefix_len + in_len + suffix_len;
  return true;
}